

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

_Bool Mips64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  uint uVar1;
  int feature;
  cs_detail *__s;
  DecodeStatus DVar2;
  uint32_t insn;
  
  if (*(char *)(ud + 0x28) == '\x01') {
    uVar1 = *(uint *)code;
    insn = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  else {
    insn = *(uint32_t *)code;
  }
  feature = *(int *)(ud + 4);
  __s = instr->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  DVar2 = decodeInstruction(DecoderTableMips6432,instr,insn,address,(MCRegisterInfo *)info,feature);
  if ((DVar2 == MCDisassembler_Fail) &&
     (DVar2 = decodeInstruction(DecoderTableMips32,instr,insn,address,(MCRegisterInfo *)info,feature
                               ), DVar2 == MCDisassembler_Fail)) {
    return false;
  }
  *size = 4;
  return DVar2 == MCDisassembler_Success;
}

Assistant:

bool Mips64_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *instr,
		uint16_t *size, uint64_t address, void *info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;

	DecodeStatus status = Mips64Disassembler_getInstruction(handle->mode, instr,
			code, code_len,
			size,
			address, handle->big_endian, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}